

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

bool __thiscall
cmComputeTargetDepends::IntraComponent
          (cmComputeTargetDepends *this,vector<int,_std::allocator<int>_> *cmap,int c,int i,
          int *head,set<int,_std::less<int>,_std::allocator<int>_> *emitted,
          set<int,_std::less<int>,_std::allocator<int>_> *visited)

{
  pointer pcVar1;
  pointer pcVar2;
  int *piVar3;
  bool bVar4;
  cmGraphEdge *edge;
  pointer pcVar5;
  bool bVar6;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar7;
  int j;
  bool local_5d;
  int local_5c;
  cmListFileBacktrace local_58;
  int *local_40;
  set<int,_std::less<int>,_std::allocator<int>_> *local_38;
  
  local_5c = i;
  pVar7 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     visited,&local_5c);
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_0035b0be:
    bVar6 = false;
  }
  else {
    pVar7 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       emitted,&local_5c);
    if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar1 = (this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar2 = *(pointer *)
                ((long)&pcVar1[local_5c].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                        super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
      local_40 = head;
      local_38 = emitted;
      for (pcVar5 = *(pointer *)
                     &pcVar1[local_5c].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
          piVar3 = local_40, bVar6 = pcVar5 != pcVar2, bVar6; pcVar5 = pcVar5 + 1) {
        local_58.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             CONCAT44(local_58.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr._4_4_,pcVar5->Dest);
        if (((cmap->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start[pcVar5->Dest] == c) && (pcVar5->Strong == true)) {
          local_5d = true;
          std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
          emplace_back<int&,bool,cmListFileBacktrace_const&>
                    ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                     ((this->FinalGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_start + local_5c),(int *)&local_58,&local_5d,
                     &pcVar5->Backtrace);
          bVar4 = IntraComponent(this,cmap,c,
                                 (int)local_58.TopEntry.
                                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,local_40,local_38,visited);
          if (!bVar4) goto LAB_0035b0b4;
        }
      }
      if (*local_40 < 0) {
        (this->ComponentTail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[c] = local_5c;
      }
      else {
        local_5d = false;
        local_58.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_58.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
        emplace_back<int&,bool,cmListFileBacktrace>
                  ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                   ((this->FinalGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_start + local_5c),local_40,&local_5d,&local_58);
        if (local_58.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_58.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      }
      *piVar3 = local_5c;
LAB_0035b0b4:
      if (bVar6) goto LAB_0035b0be;
    }
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool cmComputeTargetDepends::IntraComponent(std::vector<int> const& cmap,
                                            int c, int i, int* head,
                                            std::set<int>& emitted,
                                            std::set<int>& visited)
{
  if (!visited.insert(i).second) {
    // Cycle in utility depends!
    return false;
  }
  if (emitted.insert(i).second) {
    // Honor strong intra-component edges in the final order.
    EdgeList const& el = this->InitialGraph[i];
    for (cmGraphEdge const& edge : el) {
      int j = edge;
      if (cmap[j] == c && edge.IsStrong()) {
        this->FinalGraph[i].emplace_back(j, true, edge.GetBacktrace());
        if (!this->IntraComponent(cmap, c, j, head, emitted, visited)) {
          return false;
        }
      }
    }

    // Prepend to a linear linked-list of intra-component edges.
    if (*head >= 0) {
      this->FinalGraph[i].emplace_back(*head, false, cmListFileBacktrace());
    } else {
      this->ComponentTail[c] = i;
    }
    *head = i;
  }
  return true;
}